

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord3d *value)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pvVar4;
  string local_298;
  ostringstream local_278 [8];
  ostringstream ss_e;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string msg;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> values;
  texcoord3d *value_local;
  AsciiParser *this_local;
  
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &value->s;
  bVar1 = Expect(this,'(');
  if (!bVar1) {
    return false;
  }
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  bVar1 = SepBy1BasicType<double>(this,',',(vector<double,_std::allocator<double>_> *)local_38);
  if (bVar1) {
    bVar1 = Expect(this,')');
    if (bVar1) {
      sVar2 = ::std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_38);
      if (sVar2 != 3) {
        ::std::__cxx11::to_string(&local_e0,3);
        ::std::operator+((char *)&local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "The number of tuple elements must be ");
        ::std::operator+(&local_a0,&local_c0,", but got ");
        sVar2 = ::std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)local_38);
        ::std::__cxx11::to_string(&local_100,sVar2);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_a0);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60,&local_80,"\n");
        ::std::__cxx11::string::~string((string *)&local_80);
        ::std::__cxx11::string::~string((string *)&local_100);
        ::std::__cxx11::string::~string((string *)&local_a0);
        ::std::__cxx11::string::~string((string *)&local_c0);
        ::std::__cxx11::string::~string((string *)&local_e0);
        ::std::__cxx11::ostringstream::ostringstream(local_278);
        poVar3 = ::std::operator<<((ostream *)local_278,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ReadBasicType");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x9ba);
        ::std::operator<<(poVar3," ");
        poVar3 = ::std::operator<<((ostream *)local_278,(string *)local_60);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_298);
        ::std::__cxx11::string::~string((string *)&local_298);
        this_local._7_1_ = false;
        msg.field_2._12_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_278);
        ::std::__cxx11::string::~string((string *)local_60);
        if (msg.field_2._12_4_ != 0) goto LAB_0066103d;
      }
      pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_38,0);
      *values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage = *pvVar4;
      pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_38,1);
      values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage[1] = *pvVar4;
      pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_38,2);
      values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage[2] = *pvVar4;
      this_local._7_1_ = true;
      msg.field_2._12_4_ = 1;
    }
    else {
      this_local._7_1_ = false;
      msg.field_2._12_4_ = 1;
    }
  }
  else {
    this_local._7_1_ = false;
    msg.field_2._12_4_ = 1;
  }
LAB_0066103d:
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord3d *value) {
  if (!Expect('(')) {
    return false;
  }

  std::vector<double> values;
  if (!SepBy1BasicType<double>(',', &values)) {
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  if (values.size() != 3) {
    std::string msg = "The number of tuple elements must be " +
                      std::to_string(3) + ", but got " +
                      std::to_string(values.size()) + "\n";
    PUSH_ERROR_AND_RETURN(msg);
  }

  value->s = values[0];
  value->t = values[1];
  value->r = values[2];

  return true;
}